

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

int MIR_op_eq_p(MIR_context_t ctx,MIR_op_t op1,MIR_op_t op2)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  byte bVar3;
  MIR_item_t_conflict item;
  MIR_item_t_conflict item_00;
  int iVar4;
  char *__s1;
  char *__s2;
  bool bVar5;
  undefined1 auVar6 [16];
  
  if (op2._8_1_ != op1._8_1_) goto LAB_00116900;
  item = op1.u._0_8_;
  item_00 = op2.u._0_8_;
  switch(op1._8_1_) {
  case '\x01':
  case '\x02':
    bVar5 = op1.u._0_4_ == op2.u._0_4_;
    break;
  case '\x03':
  case '\x04':
  case '\f':
    bVar5 = item == item_00;
    break;
  case '\x05':
    uVar2 = vcmpss_avx512f(ZEXT416(op1.u._0_4_),ZEXT416(op2.u._0_4_),0);
    bVar3 = (byte)uVar2;
    goto LAB_001169c7;
  case '\x06':
    auVar6._8_8_ = 0;
    auVar6._0_8_ = item;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = item_00;
    uVar2 = vcmpsd_avx512f(auVar6,auVar1,0);
    bVar3 = (byte)uVar2;
LAB_001169c7:
    bVar5 = (bool)(bVar3 & 1);
    break;
  case '\a':
    bVar5 = op1.u._0_10_ == op2.u._0_10_;
    break;
  case '\b':
    if ((item->item_type & ~MIR_proto_item) != MIR_import_item) {
      bVar5 = item == item_00;
      break;
    }
    __s1 = MIR_item_name(ctx,item);
    __s2 = MIR_item_name(ctx,item_00);
    iVar4 = strcmp(__s1,__s2);
    goto LAB_00116a40;
  case '\t':
    if (item != item_00) goto LAB_00116900;
    iVar4 = bcmp(op1.u._8_8_,op2.u._8_8_,(size_t)item);
LAB_00116a40:
    bVar5 = iVar4 == 0;
    break;
  case '\n':
    if (((op1.u.reg._0_1_ == op2.u.reg._0_1_) && (op1.u.mem.disp == op2.u.mem.disp)) &&
       ((op1.u.mem.base == op2.u.mem.base && (op1.u.mem.index == op2.u.mem.index)))) {
      bVar5 = op1.u.mem.index == 0;
LAB_00116a04:
      bVar5 = (bool)(op1.u.mem.scale == op2.u.mem.scale | bVar5);
      break;
    }
    goto LAB_00116900;
  case '\v':
    if ((((op1.u.reg._0_1_ == op2.u.reg._0_1_) && (op1.u.mem.disp == op2.u.mem.disp)) &&
        (op1.u.mem.base == op2.u.mem.base)) && (op1.u.mem.index == op2.u.mem.index)) {
      bVar5 = op1.u.mem.index == 0xffffffff;
      goto LAB_00116a04;
    }
LAB_00116900:
    bVar5 = false;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xa28,"int MIR_op_eq_p(MIR_context_t, MIR_op_t, MIR_op_t)");
  }
  return (int)bVar5;
}

Assistant:

int MIR_op_eq_p (MIR_context_t ctx, MIR_op_t op1, MIR_op_t op2) {
  if (op1.mode != op2.mode) return FALSE;
  switch (op1.mode) {
  case MIR_OP_REG: return op1.u.reg == op2.u.reg;
  case MIR_OP_VAR: return op1.u.var == op2.u.var;
  case MIR_OP_INT: return op1.u.i == op2.u.i;
  case MIR_OP_UINT: return op1.u.u == op2.u.u;
  case MIR_OP_FLOAT: return op1.u.f == op2.u.f;
  case MIR_OP_DOUBLE: return op1.u.d == op2.u.d;
  case MIR_OP_LDOUBLE: return op1.u.ld == op2.u.ld;
  case MIR_OP_REF:
    if (op1.u.ref->item_type == MIR_export_item || op1.u.ref->item_type == MIR_import_item)
      return strcmp (MIR_item_name (ctx, op1.u.ref), MIR_item_name (ctx, op2.u.ref)) == 0;
    return op1.u.ref == op2.u.ref;
  case MIR_OP_STR:
    return op1.u.str.len == op2.u.str.len && memcmp (op1.u.str.s, op2.u.str.s, op1.u.str.len) == 0;
  case MIR_OP_MEM:
    return (op1.u.mem.type == op2.u.mem.type && op1.u.mem.disp == op2.u.mem.disp
            && op1.u.mem.base == op2.u.mem.base && op1.u.mem.index == op2.u.mem.index
            && (op1.u.mem.index == 0 || op1.u.mem.scale == op2.u.mem.scale));
  case MIR_OP_VAR_MEM:
    return (op1.u.var_mem.type == op2.u.var_mem.type && op1.u.var_mem.disp == op2.u.var_mem.disp
            && op1.u.var_mem.base == op2.u.var_mem.base
            && op1.u.var_mem.index == op2.u.var_mem.index
            && (op1.u.var_mem.index == MIR_NON_VAR || op1.u.var_mem.scale == op2.u.var_mem.scale));
  case MIR_OP_LABEL: return op1.u.label == op2.u.label;
  default: mir_assert (FALSE); /* we should not have other operands here */
  }
  return FALSE;
}